

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_8ecc8::LocalFileSystem::remove(LocalFileSystem *this,char *__filename)

{
  uint uVar1;
  char *pcVar2;
  int *piVar3;
  undefined7 extraout_var;
  undefined1 local_b0 [8];
  StatStruct statbuf;
  string *path_local;
  LocalFileSystem *this_local;
  
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)__filename;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  uVar1 = llbuild::basic::sys::unlink(pcVar2);
  piVar3 = (int *)(ulong)uVar1;
  if (uVar1 == 0) {
    this_local._7_1_ = true;
  }
  else {
    piVar3 = __errno_location();
    if (*piVar3 != 1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x15) {
        this_local._7_1_ = false;
        goto LAB_00162b7b;
      }
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    uVar1 = llbuild::basic::sys::lstat(pcVar2,(stat *)local_b0);
    piVar3 = (int *)(ulong)uVar1;
    if (uVar1 == 0) {
      piVar3 = (int *)(ulong)((uint)statbuf.st_nlink & 0xf000);
      if (((uint)statbuf.st_nlink & 0xf000) == 0x4000) {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        uVar1 = llbuild::basic::sys::rmdir(pcVar2);
        piVar3 = (int *)(ulong)uVar1;
        if (uVar1 == 0) {
          this_local._7_1_ = true;
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          this_local._7_1_ = rm_tree(this,pcVar2);
          piVar3 = (int *)CONCAT71(extraout_var,this_local._7_1_);
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
LAB_00162b7b:
  return (int)CONCAT71((int7)((ulong)piVar3 >> 8),this_local._7_1_);
}

Assistant:

virtual bool remove(const std::string& path) override {
    // Assume `path` is a regular file.
    if (llbuild::basic::sys::unlink(path.c_str()) == 0) {
      return true;
    }

#if defined(_WIN32)
    // Windows sets EACCES if the file is a directory
    if (errno != EACCES) {
      return false;
    }
#else
    // Error can't be that `path` is actually a directory (on Linux `EISDIR` will be returned since 2.1.132).
    if (errno != EPERM && errno != EISDIR) {
      return false;
    }
#endif

    // Check if `path` is a directory.
    llbuild::basic::sys::StatStruct statbuf;
    if (llbuild::basic::sys::lstat(path.c_str(), &statbuf) != 0) {
      return false;
    }

    if (S_ISDIR(statbuf.st_mode)) {
      if (llbuild::basic::sys::rmdir(path.c_str()) == 0) {
        return true;
      } else {
        return rm_tree(path.c_str());
      }
    }

    return false;
  }